

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O1

void __thiscall glu::Shader::compile(Shader *this)

{
  pointer pcVar1;
  GLenum GVar2;
  deUint64 dVar3;
  deUint64 dVar4;
  size_t sVar5;
  long lVar6;
  char *pcVar7;
  int compileStatus;
  vector<char,_std::allocator<char>_> infoLog;
  int unusedLen;
  int infoLogLen;
  allocator_type local_69;
  undefined8 local_68;
  long local_58 [2];
  vector<char,_std::allocator<char>_> local_48;
  GLsizei local_30;
  GLint local_2c;
  
  (this->m_info).compileOk = false;
  (this->m_info).compileTimeUs = 0;
  (this->m_info).infoLog._M_string_length = 0;
  *(this->m_info).infoLog._M_dataplus._M_p = '\0';
  dVar3 = deGetMicroseconds();
  (*this->m_gl->compileShader)(this->m_shader);
  dVar4 = deGetMicroseconds();
  (this->m_info).compileTimeUs = dVar4 - dVar3;
  GVar2 = (*this->m_gl->getError)();
  checkError(GVar2,"glCompileShader()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0x5a);
  local_68 = (long *)((ulong)local_68._4_4_ << 0x20);
  (*this->m_gl->getShaderiv)(this->m_shader,0x8b81,(GLint *)&local_68);
  GVar2 = (*this->m_gl->getError)();
  checkError(GVar2,"glGetShaderiv()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0x61);
  (this->m_info).compileOk = (int)local_68 != 0;
  local_2c = 0;
  (*this->m_gl->getShaderiv)(this->m_shader,0x8b84,&local_2c);
  GVar2 = (*this->m_gl->getError)();
  checkError(GVar2,"glGetShaderiv()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0x6c);
  if (0 < local_2c) {
    local_68 = (long *)((ulong)local_68 & 0xffffffffffffff00);
    std::vector<char,_std::allocator<char>_>::vector
              (&local_48,(long)(local_2c + 3),(value_type *)&local_68,&local_69);
    (*this->m_gl->getShaderInfoLog)
              (this->m_shader,
               ~(uint)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start +
               (int)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish,&local_30,
               local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    pcVar1 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = CONCAT44(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish._4_4_,
                     (int)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish) -
            (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar6 + -1] == '\0') {
      local_68 = local_58;
      if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start == (char *)0x0) {
        pcVar7 = (char *)0x1;
      }
      else {
        sVar5 = strlen(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
        pcVar7 = pcVar1 + sVar5;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,pcVar1,pcVar7);
    }
    else {
      local_68 = local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,
                 local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar6);
    }
    std::__cxx11::string::operator=((string *)&(this->m_info).infoLog,(string *)&local_68);
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
    if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void Shader::compile (void)
{
	m_info.compileOk		= false;
	m_info.compileTimeUs	= 0;
	m_info.infoLog.clear();

	{
		deUint64 compileStart = deGetMicroseconds();
		m_gl.compileShader(m_shader);
		m_info.compileTimeUs = deGetMicroseconds() - compileStart;
	}

	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCompileShader()");

	// Query status
	{
		int compileStatus = 0;

		m_gl.getShaderiv(m_shader, GL_COMPILE_STATUS, &compileStatus);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetShaderiv()");

		m_info.compileOk = compileStatus != GL_FALSE;
	}

	// Query log
	{
		int infoLogLen = 0;
		int unusedLen;

		m_gl.getShaderiv(m_shader, GL_INFO_LOG_LENGTH, &infoLogLen);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetShaderiv()");

		if (infoLogLen > 0)
		{
			// The INFO_LOG_LENGTH query and the buffer query implementations have
			// very commonly off-by-one errors. Try to work around these issues.

			// add tolerance for off-by-one in log length, buffer write, and for terminator
			std::vector<char> infoLog(infoLogLen + 3, '\0');

			// claim buf size is one smaller to protect from off-by-one writing over buffer bounds
			m_gl.getShaderInfoLog(m_shader, (int)infoLog.size() - 1, &unusedLen, &infoLog[0]);

			if (infoLog[(int)(infoLog.size()) - 1] != '\0')
			{
				// return whole buffer if null terminator was overwritten
				m_info.infoLog = std::string(&infoLog[0], infoLog.size());
			}
			else
			{
				// read as C string. infoLog is guaranteed to be 0-terminated
				m_info.infoLog = std::string(&infoLog[0]);
			}
		}
	}
}